

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void __thiscall Imath_2_5::Matrix44<double>::Matrix44(Matrix44<double> *this,Matrix44<double> *v)

{
  this->x[0][0] = v->x[0][0];
  this->x[0][1] = v->x[0][1];
  this->x[0][2] = v->x[0][2];
  this->x[0][3] = v->x[0][3];
  this->x[1][0] = v->x[1][0];
  this->x[1][1] = v->x[1][1];
  this->x[1][2] = v->x[1][2];
  this->x[1][3] = v->x[1][3];
  this->x[2][0] = v->x[2][0];
  this->x[2][1] = v->x[2][1];
  this->x[2][2] = v->x[2][2];
  this->x[2][3] = v->x[2][3];
  this->x[3][0] = v->x[3][0];
  this->x[3][1] = v->x[3][1];
  this->x[3][2] = v->x[3][2];
  this->x[3][3] = v->x[3][3];
  return;
}

Assistant:

inline
Matrix44<T>::Matrix44 (const Matrix44 &v)
{
    x[0][0] = v.x[0][0];
    x[0][1] = v.x[0][1];
    x[0][2] = v.x[0][2];
    x[0][3] = v.x[0][3];
    x[1][0] = v.x[1][0];
    x[1][1] = v.x[1][1];
    x[1][2] = v.x[1][2];
    x[1][3] = v.x[1][3];
    x[2][0] = v.x[2][0];
    x[2][1] = v.x[2][1];
    x[2][2] = v.x[2][2];
    x[2][3] = v.x[2][3];
    x[3][0] = v.x[3][0];
    x[3][1] = v.x[3][1];
    x[3][2] = v.x[3][2];
    x[3][3] = v.x[3][3];
}